

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<variant>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  iterator it;
  format_context *in_RSI;
  undefined4 *in_RDI;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  iterator in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffff98;
  variant value;
  
  formatter<variant,_char,_void>::formatter((formatter<variant,_char,_void> *)0x25a2be);
  this = context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         ::parse_context(&in_RSI->
                          super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                        );
  dynamic_formatter<char>::
  parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
            ((dynamic_formatter<char> *)this,in_stack_ffffffffffffff98);
  value.type = (anon_enum_32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  it = formatter<variant,_char,_void>::format
                 ((formatter<variant,_char,_void> *)CONCAT44(*in_RDI,in_stack_ffffffffffffff90),
                  value,in_RSI);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to(&in_RSI->
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ,it);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }